

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

void lyb_finish_node(lyd_lyb_ctx *lybctx,lyd_node *parent,uint32_t flags,lyd_meta **meta,
                    lyd_node **node,lyd_node **first_p,ly_set *parsed)

{
  lyd_node *plVar1;
  lyd_meta *plVar2;
  lyd_meta **pplVar3;
  
  plVar1 = *node;
  plVar1->flags = flags;
  pplVar3 = meta;
  while (plVar2 = *pplVar3, plVar2 != (lyd_meta *)0x0) {
    plVar2->parent = plVar1;
    pplVar3 = &plVar2->next;
  }
  plVar1->meta = *meta;
  *meta = (lyd_meta *)0x0;
  lyb_insert_node(lybctx,parent,*node,first_p,parsed);
  if (((ulong)lybctx->field_1 & 0x10000) == 0) {
    lyd_validate_node_ext(*node,&lybctx->ext_node);
  }
  *node = (lyd_node *)0x0;
  return;
}

Assistant:

static void
lyb_finish_node(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, uint32_t flags, struct lyd_meta **meta,
        struct lyd_node **node, struct lyd_node **first_p, struct ly_set *parsed)
{
    struct lyd_meta *m;

    /* set flags */
    (*node)->flags = flags;

    /* add metadata */
    LY_LIST_FOR(*meta, m) {
        m->parent = *node;
    }
    (*node)->meta = *meta;
    *meta = NULL;

    /* insert into parent */
    lyb_insert_node(lybctx, parent, *node, first_p, parsed);

    if (!(lybctx->parse_opts & LYD_PARSE_ONLY)) {
        /* store for ext instance node validation, if needed */
        (void)lyd_validate_node_ext(*node, &lybctx->ext_node);
    }

    *node = NULL;
}